

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O2

void keep_one_mv_stat(MV_STATS *mv_stats,MV *ref_mv,MV *cur_mv,AV1_COMP *cpi)

{
  bool bVar1;
  FRAME_CONTEXT *pFVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  byte bVar15;
  long lVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  aom_cdf_prob *paVar20;
  short sVar21;
  nmv_component *cdf;
  aom_cdf_prob (*cdf_00) [5];
  nmv_context *cdf_01;
  aom_cdf_prob *paVar22;
  ulong uVar23;
  bool bVar24;
  
  cdf_01 = &((cpi->td).mb.e_mbd.tile_ctx)->nmvc;
  sVar17 = cur_mv->row - ref_mv->row;
  sVar19 = cur_mv->col - ref_mv->col;
  bVar15 = (sVar17 != 0) * '\x02' | sVar19 != 0;
  sVar21 = sVar19;
  sVar18 = sVar17;
  if ((cpi->common).features.allow_high_precision_mv == true) {
    sVar21 = (sVar19 / 2) * 2;
    sVar18 = (sVar17 / 2) * 2;
  }
  iVar5 = get_symbol_cost(cdf_01->joints_cdf,(uint)bVar15);
  iVar6 = get_symbol_cost(cdf_01->joints_cdf,(uint)(sVar19 != 0) + (uint)(sVar17 != 0) * 2);
  iVar7 = get_symbol_cost(cdf_01->joints_cdf,(uint)(sVar21 != 0) + (uint)(sVar18 != 0) * 2);
  update_cdf(cdf_01->joints_cdf,bVar15,4);
  iVar5 = iVar5 + mv_stats->total_mv_rate;
  mv_stats->total_mv_rate = iVar5;
  iVar6 = iVar6 + mv_stats->hp_total_mv_rate;
  mv_stats->hp_total_mv_rate = iVar6;
  iVar7 = iVar7 + mv_stats->lp_total_mv_rate;
  mv_stats->lp_total_mv_rate = iVar7;
  mv_stats->mv_joint_count[bVar15] = mv_stats->mv_joint_count[bVar15] + 1;
  lVar14 = 12000;
  for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
    sVar4 = sVar19;
    sVar3 = sVar21;
    if (lVar16 == 0) {
      sVar4 = sVar17;
      sVar3 = sVar18;
    }
    if (sVar4 == 0) {
      iVar12 = 0;
      iVar10 = 0;
      iVar11 = 0;
    }
    else {
      uVar8 = (uint)sVar4;
      uVar13 = -uVar8;
      if (0 < (int)uVar8) {
        uVar13 = uVar8;
      }
      uVar9 = uVar13 - 1;
      iVar5 = 0x1f;
      if ((int)uVar9 >> 3 != 0) {
        for (; (uint)((int)uVar9 >> 3) >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      bVar15 = (byte)iVar5;
      if (uVar13 < 9) {
        bVar15 = 0;
      }
      iVar5 = -8 << (bVar15 & 0x1f);
      if (bVar15 == 0) {
        iVar5 = 0;
      }
      uVar13 = (int)(uVar13 + iVar5 + -1) >> 3;
      bVar1 = (cpi->common).features.allow_high_precision_mv;
      pFVar2 = (cpi->td).mb.e_mbd.tile_ctx;
      cdf = (pFVar2->nmvc).comps + lVar16;
      paVar22 = (pFVar2->nmvc).comps[lVar16].sign_cdf;
      iVar5 = get_symbol_cost(paVar22,uVar8 >> 0x1f);
      update_cdf(paVar22,(byte)(sVar4 >> 0xf) >> 7,2);
      iVar6 = get_symbol_cost(cdf->classes_cdf,(uint)bVar15);
      update_cdf(cdf->classes_cdf,bVar15,0xb);
      bVar24 = bVar15 == 0;
      cdf_00 = (pFVar2->nmvc).comps[lVar16].class0_fp_cdf + (int)uVar13;
      if (!bVar24) {
        cdf_00 = &(pFVar2->nmvc).comps[lVar16].fp_cdf;
      }
      paVar22 = (pFVar2->nmvc).comps[0].hp_cdf;
      if (bVar24) {
        paVar22 = (pFVar2->nmvc).comps[0].class0_hp_cdf;
      }
      if (bVar24) {
        paVar20 = (pFVar2->nmvc).comps[lVar16].class0_cdf;
        iVar7 = get_symbol_cost(paVar20,uVar13);
        update_cdf(paVar20,(int8_t)uVar13,2);
      }
      else {
        paVar20 = (aom_cdf_prob *)((long)pFVar2->txb_skip_cdf[0][0] + lVar14);
        iVar7 = 0;
        for (uVar23 = 0; bVar15 != uVar23; uVar23 = uVar23 + 1) {
          bVar24 = (uVar13 >> ((uint)uVar23 & 0x1f) & 1) != 0;
          iVar10 = get_symbol_cost(paVar20,(uint)bVar24);
          iVar7 = iVar7 + iVar10;
          update_cdf(paVar20,bVar24,2);
          paVar20 = paVar20 + 3;
        }
      }
      uVar13 = uVar9 >> 1 & 3;
      uVar9 = uVar9 & 1;
      iVar11 = get_symbol_cost(*cdf_00,uVar13);
      update_cdf(*cdf_00,(int8_t)uVar13,4);
      iVar12 = 0;
      if (bVar1 != false) {
        iVar12 = get_symbol_cost(paVar22 + lVar16 * 0x45,uVar9);
        update_cdf(paVar22 + lVar16 * 0x45,(int8_t)uVar9,2);
      }
      mv_stats->last_bit_zero = mv_stats->last_bit_zero + (uVar9 ^ 1);
      mv_stats->last_bit_nonzero = mv_stats->last_bit_nonzero + uVar9;
      iVar11 = iVar6 + iVar5 + iVar7 + iVar11;
      iVar10 = iVar11 + iVar12;
      iVar5 = mv_stats->total_mv_rate;
      iVar6 = mv_stats->hp_total_mv_rate;
      iVar7 = mv_stats->lp_total_mv_rate;
    }
    iVar12 = iVar12 + iVar11;
    if (sVar4 == 0) {
      iVar12 = 0;
    }
    if (sVar3 == 0) {
      iVar11 = 0;
    }
    iVar5 = iVar5 + iVar10;
    mv_stats->total_mv_rate = iVar5;
    iVar6 = iVar12 + iVar6;
    mv_stats->hp_total_mv_rate = iVar6;
    iVar7 = iVar11 + iVar7;
    mv_stats->lp_total_mv_rate = iVar7;
    lVar14 = lVar14 + 0x8a;
  }
  return;
}

Assistant:

static inline void keep_one_mv_stat(MV_STATS *mv_stats, const MV *ref_mv,
                                    const MV *cur_mv, const AV1_COMP *cpi) {
  const MACROBLOCK *const x = &cpi->td.mb;
  const MACROBLOCKD *const xd = &x->e_mbd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  nmv_context *nmvc = &ec_ctx->nmvc;
  aom_cdf_prob *joint_cdf = nmvc->joints_cdf;
  const int use_hp = cpi->common.features.allow_high_precision_mv;

  const MV diff = { cur_mv->row - ref_mv->row, cur_mv->col - ref_mv->col };
  const int mv_joint = av1_get_mv_joint(&diff);
  // TODO(chiyotsai@google.com): Estimate hp_diff when we are using lp
  const MV hp_diff = diff;
  const int hp_mv_joint = av1_get_mv_joint(&hp_diff);
  const MV truncated_diff = { (diff.row / 2) * 2, (diff.col / 2) * 2 };
  const MV lp_diff = use_hp ? truncated_diff : diff;
  const int lp_mv_joint = av1_get_mv_joint(&lp_diff);

  const int mv_joint_rate = get_symbol_cost(joint_cdf, mv_joint);
  const int hp_mv_joint_rate = get_symbol_cost(joint_cdf, hp_mv_joint);
  const int lp_mv_joint_rate = get_symbol_cost(joint_cdf, lp_mv_joint);

  update_cdf(joint_cdf, mv_joint, MV_JOINTS);

  mv_stats->total_mv_rate += mv_joint_rate;
  mv_stats->hp_total_mv_rate += hp_mv_joint_rate;
  mv_stats->lp_total_mv_rate += lp_mv_joint_rate;
  mv_stats->mv_joint_count[mv_joint]++;

  for (int comp_idx = 0; comp_idx < 2; comp_idx++) {
    const int comp_val = comp_idx ? diff.col : diff.row;
    const int hp_comp_val = comp_idx ? hp_diff.col : hp_diff.row;
    const int lp_comp_val = comp_idx ? lp_diff.col : lp_diff.row;
    int rates[5];
    av1_zero_array(rates, 5);

    const int comp_rate =
        comp_val ? keep_one_comp_stat(mv_stats, comp_val, comp_idx, cpi, rates)
                 : 0;
    // TODO(chiyotsai@google.com): Properly get hp rate when use_hp is false
    const int hp_rate =
        hp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] + rates[4] : 0;
    const int lp_rate =
        lp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] : 0;

    mv_stats->total_mv_rate += comp_rate;
    mv_stats->hp_total_mv_rate += hp_rate;
    mv_stats->lp_total_mv_rate += lp_rate;
  }
}